

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leg_track.cpp
# Opt level: O2

void __thiscall cp::LegTrack::getLegTrack(LegTrack *this,double t,Pose *r_leg_pose)

{
  double dVar1;
  double lent;
  uint uVar2;
  ulong uVar3;
  Quat *end;
  Quat *begin;
  long lVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Vector2 nex;
  double local_240;
  Quat local_238;
  double local_210;
  undefined1 local_208 [112];
  Quat local_198;
  Quat local_178;
  Quat local_158;
  Quat local_138;
  Quat local_118;
  Quat local_f8;
  Quat local_d8;
  Quat local_b8;
  Quat local_98;
  Quat local_78;
  Quat local_58;
  
  if ((*(uint *)(this + 0x444) | 2) == 6) {
    Pose::set(r_leg_pose,(Pose *)(this + 0x610));
    Pose::set(r_leg_pose + 1,(Pose *)(this + 0x6f0));
    return;
  }
  uVar3 = (ulong)*(uint *)(this + 0x440);
  dVar1 = *(double *)(this + 0x1e8);
  if (dVar1 * 0.5 <= t) {
    lent = *(double *)(this + 0x1e0);
    if (dVar1 * 0.5 + lent * 0.5 <= t) {
      if (dVar1 * 0.5 + lent <= t) {
        if (t <= *(double *)(this + 0x1f8)) {
          uVar5 = (ulong)(uVar3 == 0);
          Pose::set(r_leg_pose + uVar3,(Pose *)(this + uVar3 * 0xe0 + 0x260));
          Pose::set(r_leg_pose + uVar5,(Pose *)(this + uVar5 * 0xe0 + 0x260));
        }
        else {
          uVar5 = (ulong)(uVar3 == 0);
        }
        goto LAB_00132778;
      }
      uVar5 = (ulong)(uVar3 == 0);
      local_240 = t - dVar1 * 0.5;
      local_210 = local_240 - lent * 0.5;
      local_208._32_8_ = *(undefined8 *)(this + 0x420);
      local_208._40_8_ = *(undefined8 *)(this + 0x428);
      local_208._16_8_ = *(undefined8 *)(this + 0x430);
      local_208._24_8_ = *(undefined8 *)(this + 0x438);
      interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::lerp
                ((interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_208,
                 (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x90),
                 (Matrix<double,_2,_1,_0,_2,_1> *)(local_208 + 0x20),lent,local_240);
      uVar2 = *(uint *)(this + 0x440);
      local_238.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] =
           interpolation<double>::inter5((interpolation<double> *)(this + 0x30),local_210);
      local_238.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = (double)local_208._0_8_;
      local_238.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = (double)local_208._8_8_;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&r_leg_pose[uVar2].pp,(Matrix<double,_3,_1,_0,_3,_1> *)&local_238);
      uVar2 = *(uint *)(this + 0x440);
      lVar4 = (ulong)uVar2 * 0xe0;
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar4 + 0x630);
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar4 + 0x630 + 8);
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar4 + 0x640);
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar4 + 0x640 + 8);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar4 + 0x280);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar4 + 0x280 + 8);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar4 + 0x290);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar4 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_238,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_118
                 ,&local_138,*(double *)(this + 0x1e0),local_240);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
                (&r_leg_pose[uVar2].qq.m_coeffs,&local_238.m_coeffs);
      lVar4 = uVar5 * 0xe0;
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar4 + 0x630);
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar4 + 0x630 + 8);
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar4 + 0x640);
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar4 + 0x640 + 8);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar4 + 0x280);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar4 + 0x280 + 8);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar4 + 0x290);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar4 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_238,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_158
                 ,&local_178,*(double *)(this + 0x1e0),local_240);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
                (&r_leg_pose[uVar5].qq.m_coeffs,&local_238.m_coeffs);
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + 0x240);
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + 0x248);
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + 0x250);
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + 600);
      begin = &local_198;
      uVar6 = *(undefined4 *)(this + 0x220);
      uVar7 = *(undefined4 *)(this + 0x224);
      uVar8 = *(undefined4 *)(this + 0x228);
      uVar9 = *(undefined4 *)(this + 0x22c);
      uVar10 = *(undefined4 *)(this + 0x230);
      uVar11 = *(undefined4 *)(this + 0x234);
      uVar12 = *(undefined4 *)(this + 0x238);
      uVar13 = *(undefined4 *)(this + 0x23c);
      end = (Quat *)(local_208 + 0x50);
    }
    else {
      uVar5 = (ulong)(uVar3 == 0);
      local_240 = t + dVar1 * -0.5;
      local_208._64_8_ = *(undefined8 *)(this + 0x420);
      local_208._72_8_ = *(undefined8 *)(this + 0x428);
      local_208._48_8_ = *(undefined8 *)(this + 0x430);
      local_208._56_8_ = *(undefined8 *)(this + 0x438);
      interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::lerp
                ((interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_208,
                 (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x90),
                 (Matrix<double,_2,_1,_0,_2,_1> *)(local_208 + 0x40),lent,local_240);
      uVar2 = *(uint *)(this + 0x440);
      local_238.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = interpolation<double>::inter5((interpolation<double> *)this,local_240);
      local_238.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = (double)local_208._0_8_;
      local_238.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = (double)local_208._8_8_;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&r_leg_pose[uVar2].pp,(Matrix<double,_3,_1,_0,_3,_1> *)&local_238);
      uVar2 = *(uint *)(this + 0x440);
      lVar4 = (ulong)uVar2 * 0xe0;
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar4 + 0x630);
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar4 + 0x630 + 8);
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar4 + 0x640);
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar4 + 0x640 + 8);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar4 + 0x280);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar4 + 0x280 + 8);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar4 + 0x290);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar4 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_238,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_58,
                 &local_78,*(double *)(this + 0x1e0),local_240);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
                (&r_leg_pose[uVar2].qq.m_coeffs,&local_238.m_coeffs);
      lVar4 = uVar5 * 0xe0;
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar4 + 0x630);
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar4 + 0x630 + 8);
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar4 + 0x640);
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar4 + 0x640 + 8);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar4 + 0x280);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar4 + 0x280 + 8);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar4 + 0x290);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar4 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_238,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_98,
                 &local_b8,*(double *)(this + 0x1e0),local_240);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
                (&r_leg_pose[uVar5].qq.m_coeffs,&local_238.m_coeffs);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + 0x240);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + 0x248);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + 0x250);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + 600);
      begin = &local_d8;
      uVar6 = *(undefined4 *)(this + 0x220);
      uVar7 = *(undefined4 *)(this + 0x224);
      uVar8 = *(undefined4 *)(this + 0x228);
      uVar9 = *(undefined4 *)(this + 0x22c);
      uVar10 = *(undefined4 *)(this + 0x230);
      uVar11 = *(undefined4 *)(this + 0x234);
      uVar12 = *(undefined4 *)(this + 0x238);
      uVar13 = *(undefined4 *)(this + 0x23c);
      end = &local_f8;
    }
    *(undefined4 *)
     (end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
     array = uVar6;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 4) = uVar7;
    *(undefined4 *)
     ((end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array + 1) = uVar8;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 0xc) = uVar9;
    *(undefined4 *)
     ((end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array + 2) = uVar10;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 0x14) = uVar11;
    *(undefined4 *)
     ((end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array + 3) = uVar12;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 0x1c) = uVar13;
    interpolation<Eigen::Quaternion<double,_0>_>::lerp
              (&local_238,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),begin,end,
               *(double *)(this + 0x1e0),local_240);
    *(double *)(this + 0x210) =
         local_238.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[2];
    *(double *)(this + 0x218) =
         local_238.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[3];
    *(double *)(this + 0x200) =
         local_238.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[0];
    *(double *)(this + 0x208) =
         local_238.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[1];
  }
  else {
    uVar5 = (ulong)(uVar3 == 0);
    Pose::set(r_leg_pose + uVar3,(Pose *)(this + uVar3 * 0xe0 + 0x610));
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&r_leg_pose[uVar5].qq.m_coeffs,
               (Matrix<double,_4,_1,_0,_4,_1> *)(this + uVar5 * 0xe0 + 0x630));
  }
LAB_00132778:
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&r_leg_pose[uVar5].pp,(Matrix<double,_3,_1,_0,_3,_1> *)(this + uVar5 * 0xe0 + 0x610));
  return;
}

Assistant:

void LegTrack::getLegTrack(double t, Pose r_leg_pose[]) {
  rl spl = swl == right ? left : right;
  if (ws == starting1 || ws == stopping2) {
      r_leg_pose[right].set(bfr_landpose[right]);
      r_leg_pose[left].set(bfr_landpose[left]);
  } else {
    if (t < dst_s*0.5) {
        r_leg_pose[swl].set(bfr_landpose[swl]);
        r_leg_pose[spl].set(bfr_landpose[spl].q());
    } else if (t < dst_s*0.5 + sst_s*0.5) {
        double sst_s_time = t - dst_s*0.5;
        Vector2 nex = inter_vec2.lerp(bfr, ref, sst_s, sst_s_time);
        r_leg_pose[swl].set(Vector3(nex.x(), nex.y(), inter_z_1.inter5(sst_s_time)));
        r_leg_pose[swl].set(inter_q.lerp(bfr_landpose[swl].q(), ref_landpose[swl].q(), sst_s, sst_s_time));
        r_leg_pose[spl].set(inter_q.lerp(bfr_landpose[spl].q(), ref_landpose[spl].q(), sst_s, sst_s_time));
        waist = inter_q.lerp(bfr_waist_r, ref_waist_r, sst_s, sst_s_time);
    } else if (t < dst_s*0.5 + sst_s) {
        double sst_s_time = t - dst_s*0.5;
        double sst_s_ht = sst_s_time - sst_s*0.5;
        Vector2 nex = inter_vec2.lerp(bfr, ref, sst_s, sst_s_time);
        r_leg_pose[swl].set(Vector3(nex.x(), nex.y(), inter_z_2.inter5(sst_s_ht)));
        r_leg_pose[swl].set(inter_q.lerp(bfr_landpose[swl].q(), ref_landpose[swl].q(), sst_s, sst_s_time));
        r_leg_pose[spl].set(inter_q.lerp(bfr_landpose[spl].q(), ref_landpose[spl].q(), sst_s, sst_s_time));
        waist = inter_q.lerp(bfr_waist_r, ref_waist_r, sst_s, sst_s_time);
    } else if (t <= st_s) {
        r_leg_pose[swl].set(ref_landpose[swl]);
        r_leg_pose[spl].set(ref_landpose[spl]);
    }
    r_leg_pose[spl].set(bfr_landpose[spl].p());
  }
}